

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuscpp2xml.cpp
# Opt level: O2

QString * addFunction(QString *__return_storage_ptr__,FunctionDef *mm,bool isSignal)

{
  int iVar1;
  Data *pDVar2;
  qsizetype qVar3;
  ArgumentDef *pAVar4;
  byte bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  storage_type *psVar11;
  long lVar12;
  long lVar13;
  QDebug *this;
  uint uVar14;
  int iVar15;
  undefined7 in_register_00000011;
  char *pcVar16;
  byte bVar17;
  char16_t *pcVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  char *local_198;
  long local_188;
  QArrayDataPointer<char16_t> local_168;
  QLatin1String local_150;
  QArrayDataPointer<char16_t> local_140;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  char *local_a0;
  QArrayDataPointer<QMetaType> local_98;
  QArrayDataPointer<ArgumentDef> local_78;
  QMetaType local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = (uint)CONCAT71(in_register_00000011,isSignal);
  pcVar16 = "method";
  if (uVar14 != 0) {
    pcVar16 = "signal";
  }
  local_58.size = -0x5555555555555556;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  QString::asprintf((char *)&local_58,"    <%s name=\"%s\">\n",pcVar16);
  QVar20.m_data = (mm->normalizedType).d.ptr;
  QVar20.m_size = (mm->normalizedType).d.size;
  uVar10 = QMetaType::fromName(QVar20);
  local_b8.d._0_4_ = (undefined4)uVar10;
  local_b8.d._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
  iVar8 = QMetaType::registerHelper((QMetaType *)&local_b8);
  if (iVar8 == 0) {
    if ((mm->normalizedType).d.size != 0) {
      local_b8.d._0_4_ = 2;
      local_b8.size._4_4_ = 0;
      local_b8.d._4_4_ = 0;
      local_b8.ptr._0_4_ = 0;
      local_b8.ptr._4_4_ = 0;
      local_b8.size._0_4_ = 0;
      local_a0 = "default";
      QMessageLogger::warning();
      this = QDebug::operator<<((QDebug *)&local_78,"Unregistered return type:");
      pcVar16 = (mm->normalizedType).d.ptr;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (char *)&QByteArray::_empty;
      }
      QDebug::operator<<(this,pcVar16);
      QDebug::~QDebug((QDebug *)&local_78);
LAB_001318e9:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      goto LAB_0013184d;
    }
  }
  else if (iVar8 != 0x2b) {
    QMetaType::QMetaType(&local_60,iVar8);
    pcVar16 = (char *)QDBusMetaType::typeToSignature(local_60);
    if (pcVar16 == (char *)0x0) goto LAB_001318e9;
    psVar11 = (storage_type *)
              QByteArrayView::lengthHelperCharArray
                        ("      <arg type=\"%1\" direction=\"out\"/>\n",0x28);
    QVar21.m_data = psVar11;
    QVar21.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar21);
    typeNameToXml((QString *)&local_98,pcVar16);
    QString::arg<QString,_true>
              ((QString *)&local_b8,(QString *)&local_78,(QString *)&local_98,0,(QChar)0x20);
    QString::append((QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    lVar12 = QDBusMetaType::signatureToMetaType(pcVar16);
    if (lVar12 == 0) {
      psVar11 = (storage_type *)
                QByteArrayView::lengthHelperCharArray
                          ("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.Out0\" value=\"%1\"/>\n"
                           ,0x4c);
      QVar22.m_data = psVar11;
      QVar22.m_size = (qsizetype)&local_78;
      QString::fromLatin1(QVar22);
      pcVar16 = (mm->normalizedType).d.ptr;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = (char *)&QByteArray::_empty;
      }
      typeNameToXml((QString *)&local_98,pcVar16);
      QString::arg<QString,_true>
                ((QString *)&local_b8,(QString *)&local_78,(QString *)&local_98,0,(QChar)0x20);
      QString::append((QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    }
  }
  local_78.d = (mm->arguments).d.d;
  local_78.ptr = (mm->arguments).d.ptr;
  local_78.size = (mm->arguments).d.size;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (QMetaType *)0x0;
  local_98.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_d8.size = 0;
  iVar8 = qDBusParametersForMethod(mm,(QList<QMetaType> *)&local_98,(QString *)&local_d8);
  if (iVar8 == -1) {
    local_b8.d._0_4_ = 2;
    local_b8.size._4_4_ = 0;
    local_b8.d._4_4_ = 0;
    local_b8.ptr._0_4_ = 0;
    local_b8.ptr._4_4_ = 0;
    local_b8.size._0_4_ = 0;
    local_a0 = "default";
    QMessageLogger::warning();
    QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_d8);
    pcVar18 = local_f8.ptr;
    if (local_f8.ptr == (char16_t *)0x0) {
      pcVar18 = (char16_t *)&QByteArray::_empty;
    }
    QDebug::operator<<((QDebug *)&local_110,(char *)pcVar18);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
    QDebug::~QDebug((QDebug *)&local_110);
LAB_0013181c:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (isSignal) {
      if (local_98.size == iVar8 + 1) {
        local_b8.d._0_4_ = 0x152010;
        local_b8.d._4_4_ = 0;
        bVar6 = comparesEqual(local_98.ptr + iVar8,(QMetaType *)&local_b8);
        if (!bVar6) goto LAB_001312dd;
      }
      goto LAB_0013181c;
    }
LAB_001312dd:
    bVar17 = mm->isScriptable;
    lVar12 = 8;
    local_188 = 0x70;
    for (uVar19 = 1; uVar19 < (ulong)local_98.size; uVar19 = uVar19 + 1) {
      local_b8.d._0_4_ = 0x152010;
      local_b8.d._4_4_ = 0;
      bVar6 = comparesEqual((QMetaType *)((long)&(local_98.ptr)->d_ptr + lVar12),
                            (QMetaType *)&local_b8);
      pAVar4 = local_78.ptr;
      bVar5 = 1;
      if (!bVar6) {
        local_b8.size._0_4_ = 0;
        local_b8.size._4_4_ = 0;
        local_b8.d._0_4_ = 0;
        local_b8.d._4_4_ = 0;
        local_b8.ptr._0_4_ = 0;
        local_b8.ptr._4_4_ = 0;
        if (*(long *)((long)&((local_78.ptr)->type).name.d.size + local_188) != 0) {
          psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("name=\"%1\" ",0xb);
          QVar23.m_data = psVar11;
          QVar23.m_size = (qsizetype)&local_110;
          QString::fromLatin1(QVar23);
          QString::fromLatin1<void>
                    ((QString *)&local_128,
                     (QByteArray *)((long)&(pAVar4->type).name.d.d + local_188));
          QString::arg<QString,_true>
                    ((QString *)&local_f8,(QString *)&local_110,(QString *)&local_128,0,(QChar)0x20)
          ;
          pDVar2 = (Data *)CONCAT44(local_b8.d._4_4_,local_b8.d._0_4_);
          pcVar18 = (char16_t *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
          local_b8.d._0_4_ = SUB84(local_f8.d,0);
          local_b8.d._4_4_ = (undefined4)((ulong)local_f8.d >> 0x20);
          local_b8.ptr._0_4_ = SUB84(local_f8.ptr,0);
          local_b8.ptr._4_4_ = (undefined4)((ulong)local_f8.ptr >> 0x20);
          qVar3 = CONCAT44(local_b8.size._4_4_,(undefined4)local_b8.size);
          local_b8.size._0_4_ = (undefined4)local_f8.size;
          local_b8.size._4_4_ = (undefined4)((ulong)local_f8.size >> 0x20);
          local_f8.d = pDVar2;
          local_f8.ptr = pcVar18;
          local_f8.size = qVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
        }
        bVar6 = (long)iVar8 < (long)uVar19 || isSignal;
        pcVar16 = (char *)QDBusMetaType::typeToSignature(local_98.ptr[uVar19].d_ptr);
        psVar11 = (storage_type *)
                  QByteArrayView::lengthHelperCharArray
                            ("      <arg %1type=\"%2\" direction=\"%3\"/>\n",0x29);
        QVar24.m_data = psVar11;
        QVar24.m_size = (qsizetype)&local_110;
        QString::fromLatin1(QVar24);
        QLatin1String::QLatin1String((QLatin1String *)&local_128,pcVar16);
        local_140.d = (Data *)((ulong)bVar6 + 2);
        local_140.ptr = L"in";
        if (bVar6) {
          local_140.ptr = L"out";
        }
        QString::arg<QString&,QLatin1String,QLatin1String>
                  ((type *)&local_f8,(QString *)&local_110,(QString *)&local_b8,
                   (QLatin1String *)&local_128,(QLatin1String *)&local_140);
        QString::append((QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
        lVar13 = QDBusMetaType::signatureToMetaType(pcVar16);
        if (lVar13 == 0) {
          if (local_98.ptr[uVar19].d_ptr == (QMetaTypeInterface *)0x0) {
            local_198 = (char *)0x0;
          }
          else {
            local_198 = (local_98.ptr[uVar19].d_ptr)->name;
          }
          iVar1 = (int)uVar19 + -1;
          psVar11 = (storage_type *)
                    QByteArrayView::lengthHelperCharArray
                              ("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.%1%2\" value=\"%3\"/>\n"
                               ,0x4c);
          QVar25.m_data = psVar11;
          QVar25.m_size = (qsizetype)&local_140;
          QString::fromLatin1(QVar25);
          local_150.m_size = (ulong)bVar6 + 2;
          local_150.m_data = "In";
          if (bVar6) {
            local_150.m_data = "Out";
          }
          QString::arg<QLatin1String,_true>
                    ((QString *)&local_128,(QString *)&local_140,&local_150,0,(QChar)0x20);
          iVar15 = (int)uVar19 - iVar8;
          if (isSignal) {
            iVar15 = iVar1;
          }
          if ((long)uVar19 <= (long)iVar8) {
            iVar15 = iVar1;
          }
          QString::arg_impl((longlong)&local_110,(int)&local_128,iVar15,(QChar)0x0);
          typeNameToXml((QString *)&local_168,local_198);
          QString::arg<QString,_true>
                    ((QString *)&local_f8,(QString *)&local_110,(QString *)&local_168,0,(QChar)0x20)
          ;
          QString::append((QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        bVar5 = bVar17;
      }
      bVar17 = bVar5;
      lVar12 = lVar12 + 8;
      local_188 = local_188 + 0xa8;
    }
    uVar9 = (uVar14 & 0xff) * 0x100 + 0x100;
    if ((bVar17 & 1) != 0) {
      uVar9 = (uVar14 & 0xff) * 0x10 + 0x10;
    }
    if ((flags & uVar9) == 0) goto LAB_0013181c;
    pcVar16 = (mm->tag).d.ptr;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = (char *)&QByteArray::_empty;
    }
    cVar7 = qDBusCheckAsyncTag(pcVar16);
    pcVar16 = "method";
    if (cVar7 != '\0') {
      QString::append((QLatin1String *)&local_58);
    }
    pDVar2 = (Data *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    (__return_storage_ptr__->d).size = local_58.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("    </%1>\n",0xb);
    QVar26.m_data = psVar11;
    QVar26.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar26);
    if (isSignal) {
      pcVar16 = "signal";
    }
    local_110.d = (Data *)0x6;
    local_110.ptr = (char16_t *)pcVar16;
    QString::arg<QLatin1String,_true>
              ((QString *)&local_b8,(QString *)&local_f8,(QLatin1String *)&local_110,0,(QChar)0x20);
    QString::append((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<QMetaType>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<ArgumentDef>::~QArrayDataPointer(&local_78);
LAB_0013184d:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString addFunction(const FunctionDef &mm, bool isSignal = false) {

    QString xml = QString::asprintf("    <%s name=\"%s\">\n",
                                    isSignal ? "signal" : "method", mm.name.constData());

    // check the return type first
    int typeId = QMetaType::fromName(mm.normalizedType).id();
    if (typeId != QMetaType::Void) {
        if (typeId) {
            const char *typeName = QDBusMetaType::typeToSignature(QMetaType(typeId));
            if (typeName) {
                xml += QString::fromLatin1("      <arg type=\"%1\" direction=\"out\"/>\n")
                        .arg(typeNameToXml(typeName));

                    // do we need to describe this argument?
                    if (!QDBusMetaType::signatureToMetaType(typeName).isValid())
                        xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.Out0\" value=\"%1\"/>\n")
                            .arg(typeNameToXml(mm.normalizedType.constData()));
            } else {
                return QString();
            }
        } else if (!mm.normalizedType.isEmpty()) {
            qWarning() << "Unregistered return type:" << mm.normalizedType.constData();
            return QString();
        }
    }
    QList<ArgumentDef> names = mm.arguments;
    QList<QMetaType> types;
    QString errorMsg;
    int inputCount = qDBusParametersForMethod(mm, types, errorMsg);
    if (inputCount == -1) {
        qWarning() << qPrintable(errorMsg);
        return QString();           // invalid form
    }
    if (isSignal && inputCount + 1 != types.size())
        return QString();           // signal with output arguments?
    if (isSignal && types.at(inputCount) == QDBusMetaTypeId::message())
        return QString();           // signal with QDBusMessage argument?

    bool isScriptable = mm.isScriptable;
    for (qsizetype j = 1; j < types.size(); ++j) {
        // input parameter for a slot or output for a signal
        if (types.at(j) == QDBusMetaTypeId::message()) {
            isScriptable = true;
            continue;
        }

        QString name;
        if (!names.at(j - 1).name.isEmpty())
            name = QString::fromLatin1("name=\"%1\" ").arg(QString::fromLatin1(names.at(j - 1).name));

        bool isOutput = isSignal || j > inputCount;

        const char *signature = QDBusMetaType::typeToSignature(QMetaType(types.at(j)));
        xml += QString::fromLatin1("      <arg %1type=\"%2\" direction=\"%3\"/>\n")
                .arg(name,
                     QLatin1StringView(signature),
                     isOutput ? "out"_L1 : "in"_L1);

        // do we need to describe this argument?
        if (!QDBusMetaType::signatureToMetaType(signature).isValid()) {
            const char *typeName = QMetaType(types.at(j)).name();
            xml += QString::fromLatin1("      <annotation name=\"org.qtproject.QtDBus.QtTypeName.%1%2\" value=\"%3\"/>\n")
                    .arg(isOutput ? "Out"_L1 : "In"_L1)
                    .arg(isOutput && !isSignal ? j - inputCount : j - 1)
                    .arg(typeNameToXml(typeName));
        }
    }

    int wantedMask;
    if (isScriptable)
        wantedMask = isSignal ? QDBusConnection::ExportScriptableSignals
                              : QDBusConnection::ExportScriptableSlots;
    else
        wantedMask = isSignal ? QDBusConnection::ExportNonScriptableSignals
                              : QDBusConnection::ExportNonScriptableSlots;
    if ((flags & wantedMask) != wantedMask)
        return QString();

    if (qDBusCheckAsyncTag(mm.tag.constData()))
        // add the no-reply annotation
        xml += "      <annotation name=\"" ANNOTATION_NO_WAIT "\" value=\"true\"/>\n"_L1;

    QString retval = xml;
    retval += QString::fromLatin1("    </%1>\n").arg(isSignal ? "signal"_L1 : "method"_L1);

    return retval;
}